

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O3

_dep * __thiscall
LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false>::intl_malloc
          (LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false> *this)

{
  __pointer_type p_Var1;
  __pointer_type p_Var2;
  bool bVar3;
  
  p_Var1 = (this->head_)._M_b._M_p;
  do {
    while (p_Var2 = p_Var1, ((ulong)p_Var2 & 0xffffffffffff) == 0) {
      allocate(this);
      p_Var1 = (this->head_)._M_b._M_p;
    }
    LOCK();
    p_Var1 = (this->head_)._M_b._M_p;
    bVar3 = p_Var2 == p_Var1;
    if (bVar3) {
      (this->head_)._M_b._M_p =
           (__pointer_type)
           (((ulong)p_Var2 & 0xffff000000000000 | 0xffffffffffff) +
            (*(ulong *)(((ulong)p_Var2 & 0xffffffffffff) + 8) & 0xffffffffffff) + 1);
      p_Var1 = p_Var2;
    }
    UNLOCK();
  } while (!bVar3);
  return (_dep *)((ulong)p_Var2 & 0xffffffffffff);
}

Assistant:

T* intl_malloc()
  {
    T* ret = head_.load(std::memory_order_relaxed);
    do {
      while(clean_ptr(ret) == nullptr) {
        allocate();
        ret = head_.load(std::memory_order_relaxed);
      }
    } while(!head_.compare_exchange_weak(ret, next_ptr(clean_ptr(static_cast<T *>(clean_ptr(ret)->next)), ret)));
    
    //Notice that we do not make a new (ret) T()
    return clean_ptr(ret);
  }